

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O0

monst * beam_hit(int ddx,int ddy,int range,int weapon,_func_int_monst_ptr_obj_ptr *fhitm,
                _func_int_obj_ptr_obj_ptr *fhito,obj *obj,boolean *obj_destroyed)

{
  short sVar1;
  bool bVar2;
  xchar x_00;
  xchar y_00;
  int dx;
  char cVar3;
  boolean bVar4;
  byte bVar5;
  int x_01;
  int y_01;
  int iVar6;
  obj *poVar7;
  char *pcVar8;
  char *pcVar9;
  trap *ptVar10;
  int iVar11;
  bool local_81;
  monst *local_80;
  uint local_70;
  int local_5c;
  trap *t;
  obj *bobj;
  int local_40;
  int y;
  int x;
  boolean point_blank;
  boolean shopdoor;
  uchar typ;
  monst *mtmp;
  _func_int_obj_ptr_obj_ptr *fhito_local;
  _func_int_monst_ptr_obj_ptr *fhitm_local;
  int weapon_local;
  int range_local;
  int ddy_local;
  int ddx_local;
  
  y._2_1_ = '\0';
  y._1_1_ = '\x01';
  if (obj_destroyed != (boolean *)0x0) {
    *obj_destroyed = '\0';
  }
  if (weapon == 2) {
    bhitpos.x = u.ux + (char)ddx;
    bhitpos.y = u.uy + (char)ddy;
    fhitm_local._4_4_ = range + -1;
  }
  else {
    bhitpos.x = u.ux;
    bhitpos.y = u.uy;
    fhitm_local._4_4_ = range;
  }
  mtmp = (monst *)fhito;
  fhito_local = (_func_int_obj_ptr_obj_ptr *)fhitm;
  fhitm_local._0_4_ = weapon;
  weapon_local = ddy;
  range_local = ddx;
  if (weapon == 3) {
    tmp_at(-1,0x40002);
  }
  else if ((weapon != 0) && (weapon != 4)) {
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))) {
      local_5c = (int)obj->otyp;
    }
    else {
      local_5c = display_rng(0x219);
      local_5c = local_5c + 1;
    }
    tmp_at(-4,local_5c + 1);
  }
  do {
    iVar11 = fhitm_local._4_4_ + -1;
    bVar2 = fhitm_local._4_4_ < 1;
    fhitm_local._4_4_ = iVar11;
    if (bVar2) {
LAB_00351d40:
      if (((int)fhitm_local != 0) && ((int)fhitm_local != 4)) {
        tmp_at(-6,0);
      }
      if (y._2_1_ != '\0') {
        pay_for_damage("destroy",'\0');
      }
      return (monst *)0x0;
    }
    bhitpos.x = bhitpos.x + (char)range_local;
    bhitpos.y = bhitpos.y + (char)weapon_local;
    local_40 = (int)bhitpos.x;
    bobj._4_4_ = (int)bhitpos.y;
    if ((((local_40 < 1) || (0x4f < local_40)) || (bobj._4_4_ < 0)) || (0x14 < bobj._4_4_)) {
      bhitpos.x = bhitpos.x - (char)range_local;
      bhitpos.y = bhitpos.y - (char)weapon_local;
      goto LAB_00351d40;
    }
    if (((obj->oclass == '\x02') || (obj->oclass == '\x06')) &&
       ((objects[obj->otyp].oc_subtyp == '\x04' &&
        ((cVar3 = inside_shop(level,bhitpos.x,bhitpos.y), cVar3 != '\0' &&
         (_x = shkcatch(obj,(xchar)local_40,(xchar)bobj._4_4_), _x != (monst *)0x0)))))) {
      tmp_at(-6,0);
      return _x;
    }
    dx = range_local;
    iVar11 = weapon_local;
    y._3_1_ = level->locations[bhitpos.x][bhitpos.y].typ;
    if ((((int)fhitm_local == 1) || ((int)fhitm_local == 2)) && (y._3_1_ == 0x16)) {
      x_01 = local_40 - range_local;
      y_01 = bobj._4_4_ - weapon_local;
      if (y._1_1_ == '\0') {
        iVar6 = rn2(5);
        local_70 = (uint)((iVar6 != 0 ^ 0xffU) & 1);
      }
      else {
        local_70 = 0;
      }
      bVar4 = hits_bars(&obj,x_01,y_01,dx,iVar11,local_70,1);
      if (bVar4 != '\0') {
        if ((obj == (obj *)0x0) && (obj_destroyed != (boolean *)0x0)) {
          *obj_destroyed = '\x01';
        }
        bhitpos.x = bhitpos.x - (char)range_local;
        bhitpos.y = bhitpos.y - (char)weapon_local;
        goto LAB_00351d40;
      }
    }
    if (((int)fhitm_local == 0) &&
       (bVar4 = find_drawbridge(&local_40,(int *)((long)&bobj + 4)), bVar4 != '\0')) {
      sVar1 = obj->otyp;
      if (sVar1 == 0x186) {
LAB_00350f46:
        bVar4 = is_db_wall((int)bhitpos.x,(int)bhitpos.y);
        if (bVar4 != '\0') {
          if (((viz_array[bobj._4_4_][local_40] & 2U) != 0) ||
             ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0)) {
            discover_object((int)obj->otyp,'\x01','\x01');
          }
          open_drawbridge(local_40,bobj._4_4_);
        }
      }
      else if (sVar1 == 0x187) {
LAB_00351090:
        if (y._3_1_ == 0xc) {
          destroy_drawbridge(local_40,bobj._4_4_);
          discover_object((int)obj->otyp,'\x01','\x01');
        }
      }
      else {
        if (sVar1 != 0x18c) {
          if (sVar1 == 0x1c4) goto LAB_00351090;
          if (sVar1 == 0x1cc) goto LAB_00350f46;
          if (sVar1 != 0x1cd) goto LAB_003510bc;
        }
        if ((((viz_array[bobj._4_4_][local_40] & 2U) != 0) ||
            ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0)) &&
           (level->locations[local_40][bobj._4_4_].typ == '$')) {
          discover_object((int)obj->otyp,'\x01','\x01');
        }
        bVar4 = close_drawbridge(local_40,bobj._4_4_);
        if (bVar4 == '\0') {
          return (monst *)0x0;
        }
      }
    }
LAB_003510bc:
    if ((level->monsters[bhitpos.x][bhitpos.y] == (monst *)0x0) ||
       ((*(uint *)&level->monsters[bhitpos.x][bhitpos.y]->field_0x60 >> 9 & 1) != 0)) {
      local_80 = (monst *)0x0;
    }
    else {
      local_80 = level->monsters[bhitpos.x][bhitpos.y];
    }
    _x = local_80;
    if (local_80 == (monst *)0x0) {
      if ((((int)fhitm_local == 0) && (obj->otyp == 0x1ce)) &&
         ((*(uint *)&level->locations[bhitpos.x][bhitpos.y].field_0x6 >> 3 & 1) != 0)) {
        unmap_object((int)bhitpos.x,(int)bhitpos.y);
        newsym(local_40,bobj._4_4_);
      }
    }
    else {
      local_81 = true;
      if (bhitpos.x == local_80->mx) {
        local_81 = bhitpos.y != local_80->my;
      }
      notonhead = local_81;
      if ((int)fhitm_local == 3) {
        if ((*(uint *)&local_80->field_0x60 >> 1 & 1) == 0) {
          tmp_at(-6,0);
          return _x;
        }
        obj->ox = u.ux;
        obj->oy = u.uy;
        flash_hits_mon(local_80,obj);
      }
      else {
        if ((int)fhitm_local != 0) {
          if ((int)fhitm_local != 4) {
            tmp_at(-6,0);
          }
          if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
            return _x;
          }
          if (_x->wormno == '\0') {
            if ((viz_array[_x->my][_x->mx] & 2U) != 0) goto LAB_0035138c;
            if ((((u.uprops[0x1e].intrinsic == 0) &&
                 (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                  (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
               (((u.uprops[0x40].intrinsic != 0 ||
                 ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
                ((_x->data->mflags3 & 0x200) != 0)))) {
              bVar5 = viz_array[_x->my][_x->mx] & 1;
              goto joined_r0x00351386;
            }
          }
          else {
            bVar5 = worm_known(level,_x);
joined_r0x00351386:
            if (bVar5 != 0) {
LAB_0035138c:
              if (((((((*(uint *)&_x->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0))
                    || (u.uprops[0xc].extrinsic != 0)) ||
                   (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
                  (((*(uint *)&_x->field_0x60 >> 7 & 1) == 0 &&
                   ((*(uint *)&_x->field_0x60 >> 9 & 1) == 0)))) &&
                 (((byte)u._1052_1_ >> 5 & 1) == 0)) {
                return _x;
              }
            }
          }
          if (((((_x->data->mflags1 & 0x10000) == 0) &&
               ((poVar7 = which_armor(_x,4), poVar7 == (obj *)0x0 ||
                (poVar7 = which_armor(_x,4), poVar7->otyp != 0x4f)))) &&
              (((((u.uprops[0x1e].intrinsic != 0 ||
                  (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                   (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
                 (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
                  ((((u.uprops[0x19].intrinsic != 0 ||
                     ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
                    (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)))))) &&
                (u.uprops[0x19].blocked == 0)) ||
               (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
                (iVar11 = dist2((int)_x->mx,(int)_x->my,(int)u.ux,(int)u.uy), iVar11 < 0x41)))))) ||
             (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
              (bVar4 = match_warn_of_mon(_x), bVar4 != '\0')))) {
            return _x;
          }
          if ((int)fhitm_local != 4) {
            map_invisible(bhitpos.x,bhitpos.y);
            return _x;
          }
        }
        if ((int)fhitm_local != 4) {
          (*fhito_local)((obj *)_x,obj);
          fhitm_local._4_4_ = fhitm_local._4_4_ + -3;
        }
      }
    }
    poVar7 = obj;
    y_00 = bhitpos.y;
    x_00 = bhitpos.x;
    if (mtmp == (monst *)0x0) {
      if ((int)fhitm_local == 2) {
        if ((obj->oclass == '\f') && (level->objects[bhitpos.x][bhitpos.y] != (obj *)0x0)) {
LAB_0035180a:
          tmp_at(-6,0);
          return (monst *)0x0;
        }
        bVar4 = costly_spot(bhitpos.x,bhitpos.y);
        bVar4 = ship_object(poVar7,x_00,y_00,bVar4);
        if (bVar4 != '\0') goto LAB_0035180a;
      }
    }
    else {
      iVar11 = bhitpile(obj,(_func_int_obj_ptr_obj_ptr *)mtmp,(int)bhitpos.x,(int)bhitpos.y);
      if (iVar11 != 0) {
        fhitm_local._4_4_ = fhitm_local._4_4_ + -1;
      }
    }
    if (((((int)fhitm_local == 0) && ((y._3_1_ == 0x17 || (y._3_1_ == 0xf)))) &&
        ((iVar11 = (int)obj->otyp, iVar11 - 0x186U < 2 ||
         (((iVar11 == 0x18c || (iVar11 == 0x1c4)) || (iVar11 == 0x1cc || iVar11 == 0x1cd)))))) &&
       (bVar4 = doorlock(obj,(int)bhitpos.x,(int)bhitpos.y), bVar4 != '\0')) {
      if (((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) || (obj->otyp == 0x1c4)) {
        discover_object((int)obj->otyp,'\x01','\x01');
      }
      if (((*(uint *)&level->locations[bhitpos.x][bhitpos.y].field_0x6 >> 4 & 0x1f) == 1) &&
         (pcVar8 = in_rooms(level,bhitpos.x,bhitpos.y,0x12), *pcVar8 != '\0')) {
        y._2_1_ = '\x01';
        add_damage(bhitpos.x,bhitpos.y,400);
      }
    }
    if ((y._3_1_ < 0x11) ||
       (bVar4 = closed_door(level,(int)bhitpos.x,(int)bhitpos.y), bVar4 != '\0')) {
      bhitpos.x = bhitpos.x - (char)range_local;
      bhitpos.y = bhitpos.y - (char)weapon_local;
      goto LAB_00351d40;
    }
    if (((int)fhitm_local != 0) && ((int)fhitm_local != 4)) {
      if (((*(uint *)&level->locations[bhitpos.x][bhitpos.y].field_0x6 >> 3 & 1) != 0) &&
         ((viz_array[bobj._4_4_][local_40] & 2U) != 0)) {
        unmap_object((int)bhitpos.x,(int)bhitpos.y);
        newsym(local_40,bobj._4_4_);
      }
      tmp_at((int)bhitpos.x,(int)bhitpos.y);
      (*windowprocs.win_delay)();
      if ((((int)fhitm_local == 2) &&
          ((bVar4 = is_pool(level,(int)bhitpos.x,(int)bhitpos.y), bVar4 != '\0' ||
           (bVar4 = is_lava(level,(int)bhitpos.x,(int)bhitpos.y), bVar4 != '\0')))) ||
         ((y._3_1_ == 0x1f && ((int)fhitm_local != 3)))) goto LAB_00351d40;
    }
    if ((((int)fhitm_local == 1) && (0 < fhitm_local._4_4_)) && (obj->otyp == 0x216)) {
      poVar7 = sobj_at(0x214,level,local_40,bobj._4_4_);
      if (poVar7 == (obj *)0x0) {
        if (obj == uball) {
          bVar4 = test_move(local_40 - range_local,bobj._4_4_ - weapon_local,range_local,
                            weapon_local,0,1);
          if (bVar4 == '\0') {
            if ((viz_array[bobj._4_4_][local_40] & 2U) != 0) {
              pcVar8 = distant_name(obj,xname);
              The(pcVar8);
              pline("%s jerks to an abrupt halt.");
            }
            fhitm_local._4_4_ = 0;
          }
          else if (((u.uz.dnum == dungeon_topology.d_sokoban_dnum) &&
                   (ptVar10 = t_at(level,local_40,bobj._4_4_), ptVar10 != (trap *)0x0)) &&
                  ((((ptVar10->field_0x8 & 0x1f) == 0xb ||
                    (((ptVar10->field_0x8 & 0x1f) == 0xc || ((ptVar10->field_0x8 & 0x1f) == 0xd))))
                   || ((ptVar10->field_0x8 & 0x1f) == 0xe)))) {
            fhitm_local._4_4_ = 0;
          }
        }
      }
      else {
        if ((viz_array[bobj._4_4_][local_40] & 2U) != 0) {
          pcVar8 = distant_name(obj,xname);
          pcVar8 = The(pcVar8);
          pcVar9 = xname(poVar7);
          pcVar9 = an(pcVar9);
          pline("%s hits %s.",pcVar8,pcVar9);
        }
        fhitm_local._4_4_ = 0;
      }
    }
    y._1_1_ = '\0';
  } while( true );
}

Assistant:

struct monst *beam_hit(int ddx, int ddy, int range,	/* direction and range */
		   int weapon,			/* see values in hack.h */
		   int (*fhitm)(struct monst*, struct obj*),/* fns called when mon/obj hit */
		   int (*fhito)(struct obj*, struct obj*),
		   struct obj *obj,/* object tossed/used */
		   boolean *obj_destroyed)/* has object been deallocated? may be NULL */
{
	struct monst *mtmp;
	uchar typ;
	boolean shopdoor = FALSE, point_blank = TRUE;
	if (obj_destroyed) *obj_destroyed = FALSE;

	if (weapon == KICKED_WEAPON) {
	    /* object starts one square in front of player */
	    bhitpos.x = u.ux + ddx;
	    bhitpos.y = u.uy + ddy;
	    range--;
	} else {
	    bhitpos.x = u.ux;
	    bhitpos.y = u.uy;
	}

	if (weapon == FLASHED_LIGHT) {
	    tmp_at(DISP_BEAM, dbuf_effect(E_MISC, E_flashbeam));
	} else if (weapon != ZAPPED_WAND && weapon != INVIS_BEAM)
	    tmp_at(DISP_OBJECT, dbuf_objid(obj));

	while (range-- > 0) {
	    int x,y;

	    bhitpos.x += ddx;
	    bhitpos.y += ddy;
	    x = bhitpos.x; y = bhitpos.y;

	    if (!isok(x, y)) {
		bhitpos.x -= ddx;
		bhitpos.y -= ddy;
		break;
	    }

	    if (is_pick(obj) && inside_shop(level, x, y) &&
					   (mtmp = shkcatch(obj, x, y))) {
		tmp_at(DISP_END, 0);
		return mtmp;
	    }

	    typ = level->locations[bhitpos.x][bhitpos.y].typ;

	    /* iron bars will block anything big enough */
	    if ((weapon == THROWN_WEAPON || weapon == KICKED_WEAPON) &&
		    typ == IRONBARS &&
		    hits_bars(&obj, x - ddx, y - ddy, ddx, ddy,
			      point_blank ? 0 : !rn2(5), 1)) {
		/* caveat: obj might now be null... */
		if (obj == NULL && obj_destroyed) *obj_destroyed = TRUE;
		bhitpos.x -= ddx;
		bhitpos.y -= ddy;
		break;
	    }

	    if (weapon == ZAPPED_WAND && find_drawbridge(&x,&y)) {
		switch (obj->otyp) {
		    case WAN_OPENING:
		    case SPE_KNOCK:
			if (is_db_wall(bhitpos.x, bhitpos.y)) {
			    if (cansee(x,y) || cansee(bhitpos.x,bhitpos.y))
				makeknown(obj->otyp);
			    open_drawbridge(x,y);
			}
			break;
		    case WAN_LOCKING:
		    case SPE_WIZARD_LOCK:
			if ((cansee(x,y) || cansee(bhitpos.x, bhitpos.y))
			    && level->locations[x][y].typ == DRAWBRIDGE_DOWN)
			    makeknown(obj->otyp);
			if (!close_drawbridge(x, y)) {
			    /* Stop the ray to prevent a door being made
			     * in the drawbridge's doorway.
			     */
			    return NULL;
			}
			break;
		    case WAN_STRIKING:
		    case SPE_FORCE_BOLT:
			/* destroy closed drawbridges, not open ones */
			if (typ == DBWALL) {
			    destroy_drawbridge(x,y);
			    makeknown(obj->otyp);
			}
			break;
		}
	    }

	    if ((mtmp = m_at(level, bhitpos.x, bhitpos.y)) != 0) {
		notonhead = (bhitpos.x != mtmp->mx ||
			     bhitpos.y != mtmp->my);
		if (weapon != FLASHED_LIGHT) {
			if (weapon != ZAPPED_WAND) {
			    if (weapon != INVIS_BEAM) tmp_at(DISP_END, 0);
			    if (cansee(bhitpos.x,bhitpos.y) && !canspotmon(level, mtmp)) {
				if (weapon != INVIS_BEAM) {
				    map_invisible(bhitpos.x, bhitpos.y);
				    return mtmp;
				}
			    } else
				return mtmp;
			}
			if (weapon != INVIS_BEAM) {
			    (*fhitm)(mtmp, obj);
			    range -= 3;
			}
		} else {
		    /* FLASHED_LIGHT hitting invisible monster
		       should pass through instead of stop so
		       we call flash_hits_mon() directly rather
		       than returning mtmp back to caller. That
		       allows the flash to keep on going. Note
		       that we use mtmp->minvis not canspotmon()
		       because it makes no difference whether
		       the hero can see the monster or not.*/
		    if (mtmp->minvis) {
			obj->ox = u.ux,  obj->oy = u.uy;
			flash_hits_mon(mtmp, obj);
		    } else {
			tmp_at(DISP_END, 0);
		    	return mtmp; 	/* caller will call flash_hits_mon */
		    }
		}
	    } else {
		if (weapon == ZAPPED_WAND && obj->otyp == WAN_PROBING &&
		    level->locations[bhitpos.x][bhitpos.y].mem_invis) {
		    unmap_object(bhitpos.x, bhitpos.y);
		    newsym(x, y);
		}
	    }
	    if (fhito) {
		if (bhitpile(obj,fhito,bhitpos.x,bhitpos.y))
		    range--;
	    } else {
		if (weapon == KICKED_WEAPON &&
		      ((obj->oclass == COIN_CLASS &&
			 OBJ_AT(bhitpos.x, bhitpos.y)) ||
			    ship_object(obj, bhitpos.x, bhitpos.y,
					costly_spot(bhitpos.x, bhitpos.y)))) {
			tmp_at(DISP_END, 0);
			return NULL;
		}
	    }
	    if (weapon == ZAPPED_WAND && (IS_DOOR(typ) || typ == SDOOR)) {
		switch (obj->otyp) {
		case WAN_OPENING:
		case WAN_LOCKING:
		case WAN_STRIKING:
		case SPE_KNOCK:
		case SPE_WIZARD_LOCK:
		case SPE_FORCE_BOLT:
		    if (doorlock(obj, bhitpos.x, bhitpos.y)) {
			if (cansee(bhitpos.x, bhitpos.y) ||
			    (obj->otyp == WAN_STRIKING))
			    makeknown(obj->otyp);
			if (level->locations[bhitpos.x][bhitpos.y].doormask == D_BROKEN
			    && *in_rooms(level, bhitpos.x, bhitpos.y, SHOPBASE)) {
			    shopdoor = TRUE;
			    add_damage(bhitpos.x, bhitpos.y, 400L);
			}
		    }
		    break;
		}
	    }
	    if (!ZAP_POS(typ) || closed_door(level, bhitpos.x, bhitpos.y)) {
		bhitpos.x -= ddx;
		bhitpos.y -= ddy;
		break;
	    }
	    if (weapon != ZAPPED_WAND && weapon != INVIS_BEAM) {
		/* 'I' present but no monster: erase */
		/* do this before the tmp_at() */
		if (level->locations[bhitpos.x][bhitpos.y].mem_invis
			&& cansee(x, y)) {
		    unmap_object(bhitpos.x, bhitpos.y);
		    newsym(x, y);
		}
		tmp_at(bhitpos.x, bhitpos.y);
		win_delay_output();
		/* kicked objects fall in pools */
		if ((weapon == KICKED_WEAPON) &&
		   (is_pool(level, bhitpos.x, bhitpos.y) ||
		   is_lava(level, bhitpos.x, bhitpos.y)))
		    break;
		if (IS_SINK(typ) && weapon != FLASHED_LIGHT)
		    break;	/* physical objects fall onto sink */
	    }
	    /* limit range of ball so hero won't make an invalid move */
	    if (weapon == THROWN_WEAPON && range > 0 &&
		obj->otyp == HEAVY_IRON_BALL) {
		struct obj *bobj;
		struct trap *t;
		if ((bobj = sobj_at(BOULDER, level, x, y)) != 0) {
		    if (cansee(x,y))
			pline("%s hits %s.",
			      The(distant_name(obj, xname)), an(xname(bobj)));
		    range = 0;
		} else if (obj == uball) {
		    if (!test_move(x - ddx, y - ddy, ddx, ddy, 0, TEST_MOVE)) {
			/* nb: it didn't hit anything directly */
			if (cansee(x,y))
			    pline("%s jerks to an abrupt halt.",
				  The(distant_name(obj, xname))); /* lame */
			range = 0;
		    } else if (In_sokoban(&u.uz) && (t = t_at(level, x, y)) != 0 &&
			       (t->ttyp == PIT || t->ttyp == SPIKED_PIT ||
				t->ttyp == HOLE || t->ttyp == TRAPDOOR)) {
			/* hero falls into the trap, so ball stops */
			range = 0;
		    }
		}
	    }

	    /* thrown/kicked missile has moved away from its starting spot */
	    point_blank = FALSE;	/* affects passing through iron bars */
	}

	if (weapon != ZAPPED_WAND && weapon != INVIS_BEAM) tmp_at(DISP_END, 0);

	if (shopdoor)
	    pay_for_damage("destroy", FALSE);

	return NULL;
}